

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  SubMesh *this_00;
  Logger *pLVar4;
  basic_formatter *pbVar5;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  MemoryIOStream *this_01;
  DeadlyImportError *this_02;
  VertexData *this_03;
  size_type sVar7;
  size_t numBytes_00;
  char (*local_7b8) [7];
  allocator local_709;
  string local_708;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  string local_570;
  shared_ptr<Assimp::MemoryIOStream> local_550;
  uint8_t *local_540;
  uint8_t *indexBuffer;
  char *pcStack_530;
  uint32_t numBytes;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  string local_3b0;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  string local_218;
  size_type local_1f8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_78;
  string local_58;
  SubMesh *local_28;
  SubMesh *submesh;
  Mesh *pMStack_18;
  uint16_t id;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  submesh._6_2_ = 0;
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  this_00 = (SubMesh *)operator_new(0xa8);
  SubMesh::SubMesh(this_00);
  local_28 = this_00;
  ReadLine_abi_cxx11_(&local_58,this);
  std::__cxx11::string::operator=
            ((string *)&(local_28->super_ISubMesh).materialRef,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = Read<bool>(this);
  (local_28->super_ISubMesh).usesSharedVertexData = bVar1;
  uVar3 = Read<unsigned_int>(this);
  local_28->indexData->count = uVar3;
  local_28->indexData->faceCount = local_28->indexData->count / 3;
  bVar1 = Read<bool>(this);
  local_28->indexData->is32bit = bVar1;
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>(&local_1f0,(char (*) [17])"Reading SubMesh ");
  local_1f8 = std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::size
                        (&pMStack_18->subMeshes);
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_1f0,&local_1f8);
  Formatter::basic_formatter::operator_cast_to_string(&local_78,pbVar5);
  Logger::debug(pLVar4,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1f0);
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[16]>(&local_390,(char (*) [16])"  - Material: \'");
  pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_390,&(local_28->super_ISubMesh).materialRef);
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar6,(char (*) [2])0xc534ce);
  Formatter::basic_formatter::operator_cast_to_string(&local_218,pbVar5);
  Logger::debug(pLVar4,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_390);
  pLVar4 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>(&local_528,(char (*) [27])"  - Uses shared geometry: ");
  pcStack_530 = "false";
  if (((local_28->super_ISubMesh).usesSharedVertexData & 1U) != 0) {
    pcStack_530 = "true";
  }
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_528,&stack0xfffffffffffffad0);
  Formatter::basic_formatter::operator_cast_to_string(&local_3b0,pbVar5);
  Logger::debug(pLVar4,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_528);
  if (local_28->indexData->count != 0) {
    indexBuffer._4_4_ = local_28->indexData->count * ((local_28->indexData->is32bit & 1) * 2 + 2);
    numBytes_00 = (size_t)indexBuffer._4_4_;
    local_540 = ReadBytes(this,numBytes_00);
    this_01 = (MemoryIOStream *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x28,numBytes_00);
    MemoryIOStream::MemoryIOStream(this_01,local_540,(ulong)indexBuffer._4_4_,true);
    std::shared_ptr<Assimp::MemoryIOStream>::shared_ptr<Assimp::MemoryIOStream,void>
              (&local_550,this_01);
    std::shared_ptr<Assimp::MemoryIOStream>::operator=(&local_28->indexData->buffer,&local_550);
    std::shared_ptr<Assimp::MemoryIOStream>::~shared_ptr(&local_550);
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[5]>(&local_6e8,(char (*) [5])"  - ");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_6e8,&local_28->indexData->faceCount);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,(char (*) [13])" faces from ");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,&local_28->indexData->count);
    if ((local_28->indexData->is32bit & 1U) == 0) {
      local_7b8 = (char (*) [7])0xc759aa;
    }
    else {
      local_7b8 = (char (*) [7])0xc759a3;
    }
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,local_7b8);
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,(char (*) [13])" indexes of ");
    pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,(uint *)((long)&indexBuffer + 4));
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar6,(char (*) [7])" bytes");
    Formatter::basic_formatter::operator_cast_to_string(&local_570,pbVar5);
    Logger::debug(pLVar4,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_6e8);
  }
  if (((local_28->super_ISubMesh).usesSharedVertexData & 1U) == 0) {
    submesh._6_2_ = ReadHeader(this,true);
    if (submesh._6_2_ != 0x5000) {
      this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_708,
                 "M_SUBMESH does not contain M_GEOMETRY, but shader geometry is set to false",
                 &local_709);
      DeadlyImportError::DeadlyImportError(this_02,&local_708);
      __cxa_throw(this_02,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_03 = (VertexData *)operator_new(200);
    VertexData::VertexData(this_03);
    local_28->vertexData = this_03;
    ReadGeometry(this,local_28->vertexData);
  }
  bVar1 = AtEnd(this);
  if (!bVar1) {
    submesh._6_2_ = ReadHeader(this,true);
    while( true ) {
      bVar2 = AtEnd(this);
      bVar1 = false;
      if (((!bVar2) && (bVar1 = true, submesh._6_2_ != 0x4010)) &&
         (bVar1 = true, submesh._6_2_ != 0x4100)) {
        bVar1 = submesh._6_2_ == 0x4200;
      }
      if (!bVar1) break;
      if (submesh._6_2_ == 0x4010) {
        ReadSubMeshOperation(this,local_28);
      }
      else if (submesh._6_2_ == 0x4100) {
        ReadBoneAssignment(this,local_28->vertexData);
      }
      else if (submesh._6_2_ == 0x4200) {
        ReadSubMeshTextureAlias(this,local_28);
      }
      bVar1 = AtEnd(this);
      if (!bVar1) {
        submesh._6_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  NormalizeBoneWeights(this,local_28->vertexData);
  sVar7 = std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::size
                    (&pMStack_18->subMeshes);
  (local_28->super_ISubMesh).index = (uint)sVar7;
  std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::push_back
            (&pMStack_18->subMeshes,&local_28);
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMesh(Mesh *mesh)
{
    uint16_t id = 0;

    SubMesh *submesh = new SubMesh();
    submesh->materialRef = ReadLine();
    submesh->usesSharedVertexData = Read<bool>();

    submesh->indexData->count = Read<uint32_t>();
    submesh->indexData->faceCount = static_cast<uint32_t>(submesh->indexData->count / 3);
    submesh->indexData->is32bit = Read<bool>();

    ASSIMP_LOG_DEBUG_F( "Reading SubMesh ", mesh->subMeshes.size());
    ASSIMP_LOG_DEBUG_F( "  - Material: '", submesh->materialRef, "'");
    ASSIMP_LOG_DEBUG_F( "  - Uses shared geometry: ", submesh->usesSharedVertexData ? "true" : "false" );

    // Index buffer
    if (submesh->indexData->count > 0)
    {
        uint32_t numBytes = submesh->indexData->count * (submesh->indexData->is32bit ? sizeof(uint32_t) : sizeof(uint16_t));
        uint8_t *indexBuffer = ReadBytes(numBytes);
        submesh->indexData->buffer = MemoryStreamPtr(new Assimp::MemoryIOStream(indexBuffer, numBytes, true));

        ASSIMP_LOG_DEBUG_F( "  - ", submesh->indexData->faceCount,
            " faces from ", submesh->indexData->count, (submesh->indexData->is32bit ? " 32bit" : " 16bit"),
            " indexes of ", numBytes, " bytes");
    }

    // Vertex buffer if not referencing the shared geometry
    if (!submesh->usesSharedVertexData)
    {
        id = ReadHeader();
        if (id != M_GEOMETRY) {
            throw DeadlyImportError("M_SUBMESH does not contain M_GEOMETRY, but shader geometry is set to false");
        }

        submesh->vertexData = new VertexData();
        ReadGeometry(submesh->vertexData);
    }

    // Bone assignment, submesh operation and texture aliases
    if (!AtEnd())
    {
        id = ReadHeader();
        while (!AtEnd() &&
            (id == M_SUBMESH_OPERATION ||
             id == M_SUBMESH_BONE_ASSIGNMENT ||
             id == M_SUBMESH_TEXTURE_ALIAS))
        {
            switch(id)
            {
                case M_SUBMESH_OPERATION:
                {
                    ReadSubMeshOperation(submesh);
                    break;
                }
                case M_SUBMESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(submesh->vertexData);
                    break;
                }
                case M_SUBMESH_TEXTURE_ALIAS:
                {
                    ReadSubMeshTextureAlias(submesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(submesh->vertexData);

    submesh->index = static_cast<unsigned int>(mesh->subMeshes.size());
    mesh->subMeshes.push_back(submesh);
}